

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

uint64_t kfold_int64arith(jit_State *J,uint64_t k1,uint64_t k2,IROp op)

{
  byte bVar1;
  
  bVar1 = (byte)k1;
  switch((int)k2) {
  case 0x21:
    J = (jit_State *)((ulong)J & k1);
    break;
  case 0x22:
    J = (jit_State *)((ulong)J | k1);
    break;
  case 0x23:
    J = (jit_State *)((ulong)J ^ k1);
    break;
  case 0x24:
    J = (jit_State *)((long)J << (bVar1 & 0x3f));
    break;
  case 0x25:
    J = (jit_State *)((ulong)J >> (bVar1 & 0x3f));
    break;
  case 0x26:
    J = (jit_State *)((long)J >> (bVar1 & 0x3f));
    break;
  case 0x27:
    J = (jit_State *)((long)J << (bVar1 & 0x3f) | (ulong)J >> 0x40 - (bVar1 & 0x3f));
    break;
  case 0x28:
    J = (jit_State *)((ulong)J >> (bVar1 & 0x3f) | (long)J << 0x40 - (bVar1 & 0x3f));
    break;
  case 0x29:
    J = (jit_State *)((long)&(J->cur).nextgc.gcptr64 + k1);
    break;
  case 0x2a:
    J = (jit_State *)((long)J - k1);
    break;
  case 0x2b:
    J = (jit_State *)((long)J * k1);
  }
  return (uint64_t)J;
}

Assistant:

static uint64_t kfold_int64arith(jit_State *J, uint64_t k1, uint64_t k2,
				 IROp op)
{
  UNUSED(J);
#if LJ_HASFFI
  switch (op) {
  case IR_ADD: k1 += k2; break;
  case IR_SUB: k1 -= k2; break;
  case IR_MUL: k1 *= k2; break;
  case IR_BAND: k1 &= k2; break;
  case IR_BOR: k1 |= k2; break;
  case IR_BXOR: k1 ^= k2; break;
  case IR_BSHL: k1 <<= (k2 & 63); break;
  case IR_BSHR: k1 >>= (k2 & 63); break;
  case IR_BSAR: k1 = (uint64_t)((int64_t)k1 >> (k2 & 63)); break;
  case IR_BROL: k1 = lj_rol(k1, (k2 & 63)); break;
  case IR_BROR: k1 = lj_ror(k1, (k2 & 63)); break;
  default: lj_assertJ(0, "bad IR op %d", op); break;
  }
#else
  UNUSED(k2); UNUSED(op);
  lj_assertJ(0, "FFI IR op without FFI");
#endif
  return k1;
}